

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall IRBuilder::BuildImplicitArgIns(IRBuilder *this)

{
  ArgSlot AVar1;
  RegSlot dstRegSlot;
  JITTimeFunctionBody *pJVar2;
  uint uVar3;
  
  pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  dstRegSlot = JITTimeFunctionBody::GetConstCount(pJVar2);
  pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  AVar1 = JITTimeFunctionBody::GetInParamsCount(pJVar2);
  if (1 < AVar1) {
    uVar3 = 1;
    do {
      BuildArgIn(this,0xffffffff,dstRegSlot,(uint16)uVar3);
      uVar3 = uVar3 + 1;
      pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      AVar1 = JITTimeFunctionBody::GetInParamsCount(pJVar2);
      dstRegSlot = dstRegSlot + 1;
    } while (uVar3 < AVar1);
  }
  return;
}

Assistant:

void
IRBuilder::BuildImplicitArgIns()
{
    Js::RegSlot startReg = m_func->GetJITFunctionBody()->GetConstCount() - 1;
    for (Js::ArgSlot i = 1; i < m_func->GetJITFunctionBody()->GetInParamsCount(); i++)
    {
        this->BuildArgIn((uint32)-1, startReg + i, i);
    }
}